

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3889::StatePointer_EqualityReflexive_Test::TestBody
          (StatePointer_EqualityReflexive_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_50 [3];
  Message local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p;
  Foo foo;
  StatePointer_EqualityReflexive_Test *this_local;
  
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&gtest_ar.message_,
             (pointer_type)((long)&p.m_ptr_and_state + 4),1);
  testing::internal::EqHelper<false>::
  Compare<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
            ((EqHelper<false> *)local_30,"p","p",
             (state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&gtest_ar.message_,
             (state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x55,message);
    testing::internal::AssertHelper::operator=(local_50,&local_38);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

TEST(StatePointer, EqualityReflexive) {
	Foo foo;
	state_ptr<Foo> p{&foo, 1};
	EXPECT_EQ(p, p);
}